

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_compress_fast_continue
              (LZ4_stream_t *LZ4_stream,char *source,char *dest,int inputSize,int maxOutputSize,
              int acceleration)

{
  long lVar1;
  uint searchMatchNb;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  long *plVar8;
  int *piVar9;
  long *plVar10;
  long lVar11;
  ulong uVar12;
  long *plVar13;
  char *pcVar14;
  BYTE *d_3;
  char *pcVar15;
  ulong uVar16;
  BYTE *e;
  BYTE *pBVar17;
  ulong uVar18;
  char *pcVar19;
  ulong uVar20;
  char *pcVar21;
  char *pcVar22;
  long *plVar23;
  long *plVar24;
  int *piVar25;
  int iVar26;
  BYTE *d;
  int *piVar27;
  uint uVar28;
  int iVar29;
  BYTE *pBVar30;
  BYTE *e_3;
  long *plVar31;
  U32 *hashTable;
  long *local_c8;
  long *local_c0;
  long *local_b0;
  long *local_a0;
  char *local_70;
  
  if (*(int *)((long)LZ4_stream->table + 0x4004) != 0) {
    return 0;
  }
  uVar28 = (uint)LZ4_stream->table[0x803];
  pBVar30 = (BYTE *)((ulong)uVar28 + LZ4_stream->table[0x801]);
  pBVar17 = (BYTE *)source;
  if (pBVar30 < source) {
    pBVar17 = pBVar30;
  }
  if (uVar28 == 0) {
    pBVar17 = (BYTE *)source;
  }
  LZ4_renormDictT((LZ4_stream_t_internal *)LZ4_stream,pBVar17);
  iVar6 = 1;
  if (1 < acceleration) {
    iVar6 = acceleration;
  }
  pBVar17 = (BYTE *)(source + inputSize);
  if (pBVar17 < pBVar30 && (BYTE *)LZ4_stream->table[0x801] < pBVar17) {
    uVar2 = (int)pBVar30 - (int)pBVar17;
    uVar28 = 0x10000;
    if (uVar2 < 0x10000) {
      uVar28 = uVar2;
    }
    uVar16 = 0;
    if (3 < uVar2) {
      uVar16 = (ulong)uVar28;
    }
    *(int *)(LZ4_stream->table + 0x803) = (int)uVar16;
    LZ4_stream->table[0x801] = (long)pBVar30 - uVar16;
  }
  uVar28 = (uint)LZ4_stream->table[0x803];
  uVar16 = (ulong)uVar28;
  iVar26 = (int)dest;
  if (pBVar30 == (BYTE *)source) {
    local_c0 = (long *)source;
    if (uVar28 < 0x10000) {
      uVar2 = (uint)LZ4_stream->table[0x800];
      if (uVar2 <= uVar28) goto LAB_001536d3;
      piVar27 = (int *)0x0;
      iVar29 = 0;
      if (0x7e000000 < (uint)inputSize) goto LAB_00154290;
      plVar24 = (long *)dest;
      if (0xc < inputSize) {
        piVar25 = (int *)(source + -uVar16);
        pcVar14 = dest + maxOutputSize;
        lVar11 = (long)source - (ulong)uVar2;
        *(uint *)((long)LZ4_stream->table +
                 (ulong)((uint)((ulong)(*(long *)source * 0xcf1bbcdcbb) >> 0x1c) & 0xfff) * 4) =
             uVar2;
        plVar31 = (long *)(source + 1);
        uVar28 = (uint)((ulong)(*(long *)(source + 1) * 0xcf1bbcdcbb) >> 0x1c) & 0xfff;
        plVar10 = (long *)dest;
        do {
          uVar16 = 1;
          uVar2 = iVar6 << 6;
          while( true ) {
            plVar24 = (long *)(uVar16 + (long)plVar31);
            iVar29 = (int)lVar11;
            if (pBVar17 + -0xc < plVar24) break;
            uVar16 = (ulong)uVar28;
            piVar27 = (int *)((ulong)*(uint *)((long)LZ4_stream->table + uVar16 * 4) + lVar11);
            uVar28 = (uint)((ulong)(*plVar24 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff;
            *(int *)((long)LZ4_stream->table + uVar16 * 4) = (int)plVar31 - iVar29;
            if (((piVar25 <= piVar27) && (plVar31 <= (long *)((long)piVar27 + 0xffffU))) &&
               (*piVar27 == (int)*plVar31)) {
              iVar3 = 0;
              goto LAB_00153e18;
            }
            uVar16 = (ulong)(uVar2 >> 6);
            uVar2 = uVar2 + 1;
            plVar31 = plVar24;
          }
          iVar3 = 3;
LAB_00153e18:
          plVar24 = plVar10;
          if (iVar3 == 0) {
            if ((local_c0 < plVar31) && (piVar25 < piVar27)) {
              while( true ) {
                plVar24 = (long *)((long)plVar31 + -1);
                piVar9 = (int *)((long)piVar27 - 1);
                if (*(char *)plVar24 != (char)*piVar9) break;
                piVar27 = piVar9;
                plVar31 = plVar24;
                if ((plVar24 <= local_c0) || (piVar9 <= piVar25)) break;
              }
            }
            uVar16 = (long)plVar31 - (long)local_c0;
            plVar24 = (long *)((long)plVar10 + 1);
            uVar18 = uVar16 & 0xffffffff;
            pcVar21 = (char *)((long)plVar10 + uVar18 / 0xff + uVar18 + 9);
            if (pcVar21 <= pcVar14) {
              if ((uint)uVar16 < 0xf) {
                *(char *)plVar10 = (char)uVar16 << 4;
                plVar13 = plVar24;
              }
              else {
                iVar3 = (uint)uVar16 - 0xf;
                *(char *)plVar10 = -0x10;
                if (0xfe < iVar3) {
                  if (0x1fc < iVar3) {
                    iVar3 = 0x1fd;
                  }
                  uVar2 = ((int)plVar31 - (iVar3 + (int)local_c0)) + 0xef;
                  uVar16 = (ulong)uVar2 / 0xff;
                  memset(plVar24,0xff,(ulong)(uVar2 / 0xff + 1));
                  plVar24 = (long *)((long)plVar10 + uVar16 + 2);
                  iVar3 = ((int)plVar31 - (int)local_c0) + (int)uVar16 * -0xff + -0x10e;
                }
                *(char *)plVar24 = (char)iVar3;
                plVar13 = (long *)((long)plVar24 + 1);
              }
              plVar24 = (long *)(uVar18 + (long)plVar13);
              plVar23 = local_c0;
              do {
                *plVar13 = *plVar23;
                plVar13 = plVar13 + 1;
                plVar23 = plVar23 + 1;
              } while (plVar13 < plVar24);
            }
            iVar3 = 1;
            plVar13 = plVar24;
            if (pcVar21 <= pcVar14) {
              while( true ) {
                *(short *)plVar13 = (short)plVar31 - (short)piVar27;
                plVar24 = (long *)((long)plVar13 + 2);
                uVar2 = LZ4_count((BYTE *)((long)plVar31 + 4),(BYTE *)(piVar27 + 1),pBVar17 + -5);
                pcVar21 = (char *)((long)plVar13 + (ulong)(uVar2 >> 8) + 8);
                if (pcVar21 <= pcVar14) {
                  if (uVar2 < 0xf) {
                    *(char *)plVar10 = (char)*plVar10 + (char)uVar2;
                  }
                  else {
                    *(char *)plVar10 = (char)*plVar10 + '\x0f';
                    uVar4 = uVar2 - 0xf;
                    if (0x1fd < uVar4) {
                      uVar4 = uVar2 - 0x20d;
                      uVar5 = (uVar4 / 0x1fe) * 2;
                      memset(plVar24,0xff,(ulong)((uVar4 / 0x1fe) * 2 + 2));
                      uVar4 = (uVar5 + (uVar4 / 0x1fe) * -0x200 + uVar2) - 0x20d;
                      plVar24 = (long *)((long)plVar13 + (ulong)uVar5 + 4);
                    }
                    if (0xfe < uVar4) {
                      uVar4 = uVar4 - 0xff;
                      *(char *)plVar24 = -1;
                      plVar24 = (long *)((long)plVar24 + 1);
                    }
                    *(char *)plVar24 = (char)uVar4;
                    plVar24 = (long *)((long)plVar24 + 1);
                  }
                }
                iVar3 = 1;
                plVar31 = (long *)((long)plVar31 + (ulong)(uVar2 + 4));
                if (pcVar14 < pcVar21) goto LAB_00154167;
                local_c0 = plVar31;
                if (pBVar17 + -0xc < plVar31) {
                  iVar3 = 4;
                  goto LAB_00154167;
                }
                *(int *)((long)LZ4_stream->table +
                        (ulong)((uint)((ulong)(*(long *)((long)plVar31 + -2) * 0xcf1bbcdcbb) >> 0x1c
                                      ) & 0xfff) * 4) = ((int)plVar31 + -2) - iVar29;
                uVar18 = (ulong)((uint)((ulong)(*plVar31 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
                uVar16 = (ulong)*(uint *)((long)LZ4_stream->table + uVar18 * 4);
                piVar27 = (int *)(lVar11 + uVar16);
                *(int *)((long)LZ4_stream->table + uVar18 * 4) = (int)plVar31 - iVar29;
                if (((piVar27 < piVar25) || ((long *)(uVar16 + lVar11 + 0xffff) < plVar31)) ||
                   (*piVar27 != (int)*plVar31)) break;
                *(char *)plVar24 = '\0';
                plVar10 = plVar24;
                plVar13 = (long *)((long)plVar24 + 1);
              }
              uVar28 = (uint)((ulong)(*(long *)((long)plVar31 + 1) * 0xcf1bbcdcbb) >> 0x1c) & 0xfff;
              iVar3 = 0;
              plVar31 = (long *)((long)plVar31 + 1);
            }
          }
LAB_00154167:
          plVar10 = plVar24;
        } while (iVar3 == 0);
        if (iVar3 - 3U < 2) goto LAB_0015418e;
        goto LAB_00154247;
      }
LAB_0015418e:
      iVar29 = 0;
      uVar16 = (long)pBVar17 - (long)local_c0;
      pcVar14 = (char *)((long)plVar24 + (uVar16 + 0xf0) / 0xff + (uVar16 - (long)dest) + 1);
      if (pcVar14 <= (char *)(ulong)(uint)maxOutputSize) {
        if (uVar16 < 0xf) {
          *(char *)plVar24 = (char)uVar16 << 4;
        }
        else {
          uVar18 = uVar16 - 0xf;
          *(char *)plVar24 = -0x10;
          plVar31 = (long *)((long)plVar24 + 1);
          if (0xfe < uVar18) {
            uVar18 = (uVar16 - 0x10e) / 0xff;
            memset(plVar31,0xff,uVar18 + 1);
            plVar31 = (long *)((long)plVar24 + uVar18 + 2);
            uVar18 = (uVar16 + uVar18 * -0xff) - 0x10e;
          }
          *(char *)plVar31 = (char)uVar18;
          plVar24 = plVar31;
        }
        memcpy((char *)((long)plVar24 + 1),local_c0,uVar16);
        plVar24 = (long *)((long)plVar24 + uVar16 + 1);
      }
      iVar6 = (int)plVar24;
      if ((char *)(ulong)(uint)maxOutputSize < pcVar14) goto LAB_00154290;
LAB_0015428a:
      iVar29 = iVar6 - iVar26;
    }
    else {
LAB_001536d3:
      piVar27 = (int *)0x0;
      iVar29 = 0;
      if ((uint)inputSize < 0x7e000001) {
        plVar24 = (long *)dest;
        if (0xc < inputSize) {
          pcVar14 = dest + maxOutputSize;
          uVar28 = (uint)LZ4_stream->table[0x800];
          lVar11 = (long)source - (ulong)uVar28;
          *(uint *)((long)LZ4_stream->table +
                   (ulong)((uint)((ulong)(*(long *)source * 0xcf1bbcdcbb) >> 0x1c) & 0xfff) * 4) =
               uVar28;
          plVar31 = (long *)(source + 1);
          uVar28 = (uint)((ulong)(*(long *)(source + 1) * 0xcf1bbcdcbb) >> 0x1c) & 0xfff;
          plVar10 = (long *)dest;
          do {
            uVar18 = 1;
            uVar2 = iVar6 << 6;
            while( true ) {
              plVar24 = (long *)(uVar18 + (long)plVar31);
              iVar29 = (int)lVar11;
              if (pBVar17 + -0xc < plVar24) break;
              uVar18 = (ulong)uVar28;
              piVar27 = (int *)((ulong)*(uint *)((long)LZ4_stream->table + uVar18 * 4) + lVar11);
              uVar28 = (uint)((ulong)(*plVar24 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff;
              *(int *)((long)LZ4_stream->table + uVar18 * 4) = (int)plVar31 - iVar29;
              if ((plVar31 <= (long *)((long)piVar27 + 0xffffU)) && (*piVar27 == (int)*plVar31)) {
                iVar3 = 0;
                goto LAB_001537d3;
              }
              uVar18 = (ulong)(uVar2 >> 6);
              uVar2 = uVar2 + 1;
              plVar31 = plVar24;
            }
            iVar3 = 3;
LAB_001537d3:
            plVar24 = plVar10;
            if (iVar3 == 0) {
              if ((local_c0 < plVar31) && (source + -uVar16 < piVar27)) {
                while( true ) {
                  plVar24 = (long *)((long)plVar31 + -1);
                  piVar25 = (int *)((long)piVar27 + -1);
                  if (*(char *)plVar24 != *(char *)piVar25) break;
                  piVar27 = piVar25;
                  plVar31 = plVar24;
                  if ((plVar24 <= local_c0) || (piVar25 <= source + -uVar16)) break;
                }
              }
              uVar18 = (long)plVar31 - (long)local_c0;
              plVar24 = (long *)((long)plVar10 + 1);
              uVar20 = uVar18 & 0xffffffff;
              pcVar21 = (char *)((long)plVar10 + uVar20 / 0xff + uVar20 + 9);
              if (pcVar21 <= pcVar14) {
                if ((uint)uVar18 < 0xf) {
                  *(char *)plVar10 = (char)uVar18 << 4;
                  plVar13 = plVar24;
                }
                else {
                  iVar3 = (uint)uVar18 - 0xf;
                  *(char *)plVar10 = -0x10;
                  if (0xfe < iVar3) {
                    if (0x1fc < iVar3) {
                      iVar3 = 0x1fd;
                    }
                    uVar2 = ((int)plVar31 - (iVar3 + (int)local_c0)) + 0xef;
                    uVar18 = (ulong)uVar2 / 0xff;
                    memset(plVar24,0xff,(ulong)(uVar2 / 0xff + 1));
                    plVar24 = (long *)((long)plVar10 + uVar18 + 2);
                    iVar3 = ((int)plVar31 - (int)local_c0) + (int)uVar18 * -0xff + -0x10e;
                  }
                  *(char *)plVar24 = (char)iVar3;
                  plVar13 = (long *)((long)plVar24 + 1);
                }
                plVar24 = (long *)(uVar20 + (long)plVar13);
                plVar23 = local_c0;
                do {
                  *plVar13 = *plVar23;
                  plVar13 = plVar13 + 1;
                  plVar23 = plVar23 + 1;
                } while (plVar13 < plVar24);
              }
              iVar3 = 1;
              plVar13 = plVar24;
              if (pcVar21 <= pcVar14) {
                while( true ) {
                  *(short *)plVar13 = (short)plVar31 - (short)piVar27;
                  plVar24 = (long *)((long)plVar13 + 2);
                  uVar2 = LZ4_count((BYTE *)((long)plVar31 + 4),(BYTE *)(piVar27 + 1),pBVar17 + -5);
                  pcVar21 = (char *)((long)plVar13 + (ulong)(uVar2 >> 8) + 8);
                  if (pcVar21 <= pcVar14) {
                    if (uVar2 < 0xf) {
                      *(char *)plVar10 = (char)*plVar10 + (char)uVar2;
                    }
                    else {
                      *(char *)plVar10 = (char)*plVar10 + '\x0f';
                      uVar4 = uVar2 - 0xf;
                      if (0x1fd < uVar4) {
                        uVar4 = uVar2 - 0x20d;
                        uVar5 = (uVar4 / 0x1fe) * 2;
                        memset(plVar24,0xff,(ulong)((uVar4 / 0x1fe) * 2 + 2));
                        uVar4 = (uVar5 + (uVar4 / 0x1fe) * -0x200 + uVar2) - 0x20d;
                        plVar24 = (long *)((long)plVar13 + (ulong)uVar5 + 4);
                      }
                      if (0xfe < uVar4) {
                        uVar4 = uVar4 - 0xff;
                        *(char *)plVar24 = -1;
                        plVar24 = (long *)((long)plVar24 + 1);
                      }
                      *(char *)plVar24 = (char)uVar4;
                      plVar24 = (long *)((long)plVar24 + 1);
                    }
                  }
                  plVar31 = (long *)((long)plVar31 + (ulong)(uVar2 + 4));
                  if (pcVar14 < pcVar21) {
                    iVar3 = 1;
                    goto LAB_00153b0e;
                  }
                  local_c0 = plVar31;
                  if (pBVar17 + -0xc < plVar31) {
                    iVar3 = 4;
                    goto LAB_00153b0e;
                  }
                  *(int *)((long)LZ4_stream->table +
                          (ulong)((uint)((ulong)(*(long *)((long)plVar31 + -2) * 0xcf1bbcdcbb) >>
                                        0x1c) & 0xfff) * 4) = ((int)plVar31 + -2) - iVar29;
                  uVar18 = (ulong)((uint)((ulong)(*plVar31 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
                  uVar20 = (ulong)*(uint *)((long)LZ4_stream->table + uVar18 * 4);
                  piVar27 = (int *)(lVar11 + uVar20);
                  *(int *)((long)LZ4_stream->table + uVar18 * 4) = (int)plVar31 - iVar29;
                  if (((long *)(lVar11 + uVar20 + 0xffff) < plVar31) || (*piVar27 != (int)*plVar31))
                  break;
                  *(char *)plVar24 = '\0';
                  plVar10 = plVar24;
                  plVar13 = (long *)((long)plVar24 + 1);
                }
                uVar28 = (uint)((ulong)(*(long *)((long)plVar31 + 1) * 0xcf1bbcdcbb) >> 0x1c) &
                         0xfff;
                iVar3 = 0;
                plVar31 = (long *)((long)plVar31 + 1);
              }
            }
LAB_00153b0e:
            plVar10 = plVar24;
          } while (iVar3 == 0);
          if (1 < iVar3 - 3U) {
LAB_00154247:
            iVar29 = 0;
            goto LAB_00154290;
          }
        }
        iVar29 = 0;
        uVar16 = (long)pBVar17 - (long)local_c0;
        pcVar14 = (char *)((long)plVar24 + (uVar16 + 0xf0) / 0xff + (uVar16 - (long)dest) + 1);
        if (pcVar14 <= (char *)(ulong)(uint)maxOutputSize) {
          if (uVar16 < 0xf) {
            *(char *)plVar24 = (char)uVar16 << 4;
          }
          else {
            uVar18 = uVar16 - 0xf;
            *(char *)plVar24 = -0x10;
            plVar31 = (long *)((long)plVar24 + 1);
            if (0xfe < uVar18) {
              uVar18 = (uVar16 - 0x10e) / 0xff;
              memset(plVar31,0xff,uVar18 + 1);
              plVar31 = (long *)((long)plVar24 + uVar18 + 2);
              uVar18 = (uVar16 + uVar18 * -0xff) - 0x10e;
            }
            *(char *)plVar31 = (char)uVar18;
            plVar24 = plVar31;
          }
          memcpy((char *)((long)plVar24 + 1),local_c0,uVar16);
          plVar24 = (long *)((long)plVar24 + uVar16 + 1);
        }
        iVar6 = (int)plVar24;
        if (pcVar14 <= (char *)(ulong)(uint)maxOutputSize) goto LAB_0015428a;
      }
    }
LAB_00154290:
    iVar6 = (int)LZ4_stream->table[0x803] + inputSize;
    goto LAB_001542eb;
  }
  local_a0 = (long *)source;
  if (uVar28 < 0x10000) {
    uVar2 = (uint)LZ4_stream->table[0x800];
    if (uVar2 <= uVar28) goto LAB_0015300d;
    iVar29 = 0;
    if ((uint)inputSize < 0x7e000001) {
      local_c8 = (long *)dest;
      if (inputSize < 0xd) {
LAB_00153c1e:
        iVar29 = 0;
        uVar16 = (long)pBVar17 - (long)local_a0;
        pcVar14 = (char *)((long)local_c8 + (uVar16 + 0xf0) / 0xff + (uVar16 - (long)dest) + 1);
        if (pcVar14 <= (char *)(ulong)(uint)maxOutputSize) {
          if (uVar16 < 0xf) {
            *(char *)local_c8 = (char)uVar16 << 4;
          }
          else {
            uVar18 = uVar16 - 0xf;
            *(char *)local_c8 = -0x10;
            plVar24 = (long *)((long)local_c8 + 1);
            if (0xfe < uVar18) {
              uVar18 = (uVar16 - 0x10e) / 0xff;
              memset(plVar24,0xff,uVar18 + 1);
              plVar24 = (long *)((long)local_c8 + uVar18 + 2);
              uVar18 = (uVar16 + uVar18 * -0xff) - 0x10e;
            }
            *(char *)plVar24 = (char)uVar18;
            local_c8 = plVar24;
          }
          memcpy((char *)((long)local_c8 + 1),local_a0,uVar16);
          local_c8 = (long *)((long)local_c8 + uVar16 + 1);
        }
        if (pcVar14 <= (char *)(ulong)(uint)maxOutputSize) {
          iVar29 = (int)local_c8 - iVar26;
        }
        goto LAB_001542e2;
      }
      pcVar14 = (char *)LZ4_stream->table[0x801];
      plVar24 = (long *)(pBVar17 + -0xc);
      plVar10 = (long *)(pBVar17 + -5);
      pcVar22 = dest + maxOutputSize;
      lVar11 = (long)source - (ulong)uVar2;
      local_70 = (char *)0xfff;
      *(uint *)((long)LZ4_stream->table +
               (ulong)((uint)((ulong)(*(long *)source * 0xcf1bbcdcbb) >> 0x1c) & 0xfff) * 4) = uVar2
      ;
      plVar31 = (long *)(source + 1);
      uVar28 = (uint)((ulong)(*(long *)(source + 1) * 0xcf1bbcdcbb) >> 0x1c) & 0xfff;
      pcVar21 = (char *)0x0;
      pcVar15 = source;
      do {
        uVar18 = 1;
        uVar2 = iVar6 << 6;
        while( true ) {
          plVar13 = (long *)(uVar18 + (long)plVar31);
          iVar29 = (int)lVar11;
          if (plVar24 < plVar13) {
            iVar3 = 3;
          }
          else {
            uVar18 = (ulong)uVar28;
            local_70 = (char *)((ulong)*(uint *)((long)LZ4_stream->table + uVar18 * 4) + lVar11);
            iVar3 = 0;
            pcVar15 = source;
            pcVar21 = (char *)0x0;
            if (local_70 < source) {
              pcVar15 = pcVar14;
              pcVar21 = pcVar14 + (uVar16 - (long)source);
            }
            uVar28 = (uint)((ulong)(*plVar13 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff;
            *(int *)((long)LZ4_stream->table + uVar18 * 4) = (int)plVar31 - iVar29;
          }
          if (plVar24 < plVar13) goto LAB_00152bec;
          if (((source + -uVar16 <= local_70) && (plVar31 <= local_70 + 0xffff)) &&
             (*(int *)(local_70 + (long)pcVar21) == (int)*plVar31)) break;
          uVar18 = (ulong)(uVar2 >> 6);
          uVar2 = uVar2 + 1;
          plVar31 = plVar13;
        }
        iVar3 = 0;
LAB_00152bec:
        if (iVar3 == 0) {
          if ((local_a0 < plVar31) && (pcVar15 < local_70 + (long)pcVar21)) {
            pcVar19 = local_70;
            do {
              plVar13 = (long *)((long)plVar31 + -1);
              local_70 = pcVar19;
              if ((*(char *)plVar13 != pcVar19[(long)(pcVar21 + -1)]) ||
                 (local_70 = pcVar19 + -1, plVar31 = plVar13, plVar13 <= local_a0)) break;
              pcVar7 = pcVar19 + (long)(pcVar21 + -1);
              pcVar19 = local_70;
            } while (pcVar15 < pcVar7);
          }
          uVar18 = (long)plVar31 - (long)local_a0;
          plVar13 = (long *)((long)local_c8 + 1);
          uVar20 = uVar18 & 0xffffffff;
          pcVar19 = (char *)((long)local_c8 + uVar20 / 0xff + uVar20 + 9);
          if (pcVar19 <= pcVar22) {
            if ((uint)uVar18 < 0xf) {
              *(char *)local_c8 = (char)uVar18 << 4;
              plVar23 = plVar13;
            }
            else {
              iVar3 = (uint)uVar18 - 0xf;
              *(char *)local_c8 = -0x10;
              if (0xfe < iVar3) {
                if (0x1fc < iVar3) {
                  iVar3 = 0x1fd;
                }
                uVar2 = ((int)plVar31 - (iVar3 + (int)local_a0)) + 0xef;
                uVar18 = (ulong)uVar2 / 0xff;
                memset(plVar13,0xff,(ulong)(uVar2 / 0xff + 1));
                plVar13 = (long *)((long)local_c8 + uVar18 + 2);
                iVar3 = ((int)plVar31 - (int)local_a0) + (int)uVar18 * -0xff + -0x10e;
              }
              *(char *)plVar13 = (char)iVar3;
              plVar23 = (long *)((long)plVar13 + 1);
            }
            plVar13 = (long *)(uVar20 + (long)plVar23);
            plVar8 = local_a0;
            do {
              *plVar23 = *plVar8;
              plVar23 = plVar23 + 1;
              plVar8 = plVar8 + 1;
            } while (plVar23 < plVar13);
          }
          if (pcVar22 < pcVar19) {
LAB_00152fe7:
            local_c8 = plVar13;
            iVar3 = 1;
          }
          else {
            while( true ) {
              *(short *)plVar13 = (short)plVar31 - (short)local_70;
              if (pcVar15 == pcVar14) {
                pcVar19 = local_70 + (long)pcVar21;
                plVar23 = (long *)(pcVar14 + (uVar16 - (long)pcVar19) + (long)plVar31);
                if (plVar10 < pcVar14 + (uVar16 - (long)pcVar19) + (long)plVar31) {
                  plVar23 = plVar10;
                }
                uVar2 = LZ4_count((BYTE *)((long)plVar31 + 4),
                                  (BYTE *)(local_70 + (long)(pcVar21 + 4)),(BYTE *)plVar23);
                uVar18 = (ulong)uVar2;
                plVar31 = (long *)((long)plVar31 + (ulong)(uVar2 + 4));
                local_70 = pcVar19;
                if (plVar31 == plVar23) {
                  uVar4 = LZ4_count((BYTE *)plVar31,(BYTE *)source,(BYTE *)plVar10);
                  uVar18 = (ulong)(uVar2 + uVar4);
                  plVar31 = (long *)((long)plVar31 + (ulong)uVar4);
                }
              }
              else {
                uVar2 = LZ4_count((BYTE *)((long)plVar31 + 4),(BYTE *)(local_70 + 4),(BYTE *)plVar10
                                 );
                uVar18 = (ulong)uVar2;
                plVar31 = (long *)((long)plVar31 + (ulong)(uVar2 + 4));
              }
              plVar23 = (long *)((long)plVar13 + 2);
              uVar2 = (uint)uVar18;
              pcVar19 = (char *)((long)plVar13 + (uVar18 >> 8) + 8);
              if (pcVar19 <= pcVar22) {
                if (uVar2 < 0xf) {
                  *(char *)local_c8 = (char)*local_c8 + (char)uVar18;
                }
                else {
                  *(char *)local_c8 = (char)*local_c8 + '\x0f';
                  uVar4 = uVar2 - 0xf;
                  if (0x1fd < uVar4) {
                    uVar4 = uVar2 - 0x20d;
                    uVar5 = (uVar4 / 0x1fe) * 2;
                    memset(plVar23,0xff,(ulong)((uVar4 / 0x1fe) * 2 + 2));
                    uVar4 = (uVar5 + (uVar4 / 0x1fe) * -0x200 + uVar2) - 0x20d;
                    plVar23 = (long *)((long)plVar13 + (ulong)uVar5 + 4);
                  }
                  if (0xfe < uVar4) {
                    uVar4 = uVar4 - 0xff;
                    *(char *)plVar23 = -1;
                    plVar23 = (long *)((long)plVar23 + 1);
                  }
                  *(char *)plVar23 = (char)uVar4;
                  plVar23 = (long *)((long)plVar23 + 1);
                }
              }
              local_c8 = plVar23;
              plVar13 = local_c8;
              if (pcVar22 < pcVar19) goto LAB_00152fe7;
              local_a0 = plVar31;
              if (plVar24 < plVar31) {
                iVar3 = 4;
                goto LAB_00152fed;
              }
              *(int *)((long)LZ4_stream->table +
                      (ulong)((uint)((ulong)(*(long *)((long)plVar31 + -2) * 0xcf1bbcdcbb) >> 0x1c)
                             & 0xfff) * 4) = ((int)plVar31 + -2) - iVar29;
              uVar20 = (ulong)((uint)((ulong)(*plVar31 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
              uVar18 = (ulong)*(uint *)((long)LZ4_stream->table + uVar20 * 4);
              local_70 = (char *)(lVar11 + uVar18);
              pcVar15 = source;
              pcVar21 = (char *)0x0;
              if (local_70 < source) {
                pcVar15 = pcVar14;
                pcVar21 = pcVar14 + (uVar16 - (long)source);
              }
              *(int *)((long)LZ4_stream->table + uVar20 * 4) = (int)plVar31 - iVar29;
              if (((local_70 < source + -uVar16) || ((long *)(uVar18 + lVar11 + 0xffff) < plVar31))
                 || (*(int *)(local_70 + (long)pcVar21) != (int)*plVar31)) break;
              plVar13 = (long *)((long)local_c8 + 1);
              *(char *)local_c8 = '\0';
            }
            uVar28 = (uint)((ulong)(*(long *)((long)plVar31 + 1) * 0xcf1bbcdcbb) >> 0x1c) & 0xfff;
            iVar3 = 0;
            plVar31 = (long *)((long)plVar31 + 1);
          }
        }
LAB_00152fed:
      } while (iVar3 == 0);
      if (iVar3 - 3U < 2) goto LAB_00153c1e;
LAB_00153cd5:
      iVar29 = 0;
    }
  }
  else {
LAB_0015300d:
    iVar29 = 0;
    if ((uint)inputSize < 0x7e000001) {
      local_b0 = (long *)dest;
      if (0xc < inputSize) {
        pcVar14 = (char *)LZ4_stream->table[0x801];
        plVar24 = (long *)(pBVar17 + -0xc);
        plVar10 = (long *)(pBVar17 + -5);
        pcVar22 = dest + maxOutputSize;
        uVar28 = (uint)LZ4_stream->table[0x800];
        lVar11 = (long)source - (ulong)uVar28;
        local_70 = (char *)(ulong)((uint)((ulong)(*(long *)source * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
        *(uint *)((long)LZ4_stream->table + (long)local_70 * 4) = uVar28;
        plVar31 = (long *)(source + 1);
        uVar18 = (ulong)((uint)((ulong)(*(long *)(source + 1) * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
        pcVar21 = (char *)0x0;
        pcVar15 = source;
        do {
          uVar20 = 1;
          uVar28 = iVar6 << 6;
          while( true ) {
            plVar13 = (long *)(uVar20 + (long)plVar31);
            iVar29 = (int)lVar11;
            if (plVar24 < plVar13) {
              iVar3 = 3;
            }
            else {
              local_70 = (char *)((ulong)*(uint *)((long)LZ4_stream->table + uVar18 * 4) + lVar11);
              iVar3 = 0;
              pcVar15 = source;
              pcVar21 = (char *)0x0;
              if (local_70 < source) {
                pcVar15 = pcVar14;
                pcVar21 = pcVar14 + (uVar16 - (long)source);
              }
              lVar1 = *plVar13;
              *(int *)((long)LZ4_stream->table + uVar18 * 4) = (int)plVar31 - iVar29;
              uVar18 = (ulong)((uint)((ulong)(lVar1 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
            }
            if (plVar24 < plVar13) goto LAB_00153177;
            if ((plVar31 <= local_70 + 0xffff) &&
               (*(int *)(local_70 + (long)pcVar21) == (int)*plVar31)) break;
            uVar20 = (ulong)(uVar28 >> 6);
            uVar28 = uVar28 + 1;
            plVar31 = plVar13;
          }
          iVar3 = 0;
LAB_00153177:
          plVar13 = local_b0;
          if (iVar3 == 0) {
            if ((local_a0 < plVar31) && (pcVar15 < local_70 + (long)pcVar21)) {
              pcVar19 = local_70;
              do {
                plVar13 = (long *)((long)plVar31 + -1);
                local_70 = pcVar19;
                if ((*(char *)plVar13 != pcVar19[(long)(pcVar21 + -1)]) ||
                   (local_70 = pcVar19 + -1, plVar31 = plVar13, plVar13 <= local_a0)) break;
                pcVar7 = pcVar19 + (long)(pcVar21 + -1);
                pcVar19 = local_70;
              } while (pcVar15 < pcVar7);
            }
            uVar20 = (long)plVar31 - (long)local_a0;
            plVar13 = (long *)((long)local_b0 + 1);
            uVar12 = uVar20 & 0xffffffff;
            pcVar19 = (char *)((long)local_b0 + uVar12 / 0xff + uVar12 + 9);
            if (pcVar19 <= pcVar22) {
              if ((uint)uVar20 < 0xf) {
                *(char *)local_b0 = (char)uVar20 << 4;
                plVar23 = plVar13;
              }
              else {
                iVar3 = (uint)uVar20 - 0xf;
                *(char *)local_b0 = -0x10;
                if (0xfe < iVar3) {
                  if (0x1fc < iVar3) {
                    iVar3 = 0x1fd;
                  }
                  uVar28 = ((int)plVar31 - (iVar3 + (int)local_a0)) + 0xef;
                  uVar20 = (ulong)uVar28 / 0xff;
                  memset(plVar13,0xff,(ulong)(uVar28 / 0xff + 1));
                  plVar13 = (long *)((long)local_b0 + uVar20 + 2);
                  iVar3 = ((int)plVar31 - (int)local_a0) + (int)uVar20 * -0xff + -0x10e;
                }
                *(char *)plVar13 = (char)iVar3;
                plVar23 = (long *)((long)plVar13 + 1);
              }
              plVar13 = (long *)(uVar12 + (long)plVar23);
              plVar8 = local_a0;
              do {
                *plVar23 = *plVar8;
                plVar23 = plVar23 + 1;
                plVar8 = plVar8 + 1;
              } while (plVar23 < plVar13);
            }
            iVar3 = 1;
            if (pcVar19 <= pcVar22) {
              while( true ) {
                *(short *)plVar13 = (short)plVar31 - (short)local_70;
                if (pcVar15 == pcVar14) {
                  pcVar19 = local_70 + (long)pcVar21;
                  plVar23 = (long *)(pcVar14 + (uVar16 - (long)pcVar19) + (long)plVar31);
                  if (plVar10 < pcVar14 + (uVar16 - (long)pcVar19) + (long)plVar31) {
                    plVar23 = plVar10;
                  }
                  uVar28 = LZ4_count((BYTE *)((long)plVar31 + 4),
                                     (BYTE *)(local_70 + (long)(pcVar21 + 4)),(BYTE *)plVar23);
                  plVar31 = (long *)((long)plVar31 + (ulong)(uVar28 + 4));
                  local_70 = pcVar19;
                  if (plVar31 == plVar23) {
                    uVar2 = LZ4_count((BYTE *)plVar31,(BYTE *)source,(BYTE *)plVar10);
                    uVar28 = uVar28 + uVar2;
                    plVar31 = (long *)((long)plVar31 + (ulong)uVar2);
                  }
                }
                else {
                  uVar28 = LZ4_count((BYTE *)((long)plVar31 + 4),(BYTE *)(local_70 + 4),
                                     (BYTE *)plVar10);
                  plVar31 = (long *)((long)plVar31 + (ulong)(uVar28 + 4));
                }
                plVar23 = (long *)((long)plVar13 + 2);
                pcVar19 = (char *)((long)plVar13 + (ulong)(uVar28 >> 8) + 8);
                if (pcVar19 <= pcVar22) {
                  if (uVar28 < 0xf) {
                    *(char *)local_b0 = (char)*local_b0 + (char)uVar28;
                  }
                  else {
                    *(char *)local_b0 = (char)*local_b0 + '\x0f';
                    uVar2 = uVar28 - 0xf;
                    if (0x1fd < uVar2) {
                      uVar2 = uVar28 - 0x20d;
                      uVar4 = (uVar2 / 0x1fe) * 2;
                      memset(plVar23,0xff,(ulong)((uVar2 / 0x1fe) * 2 + 2));
                      uVar2 = (uVar4 + (uVar2 / 0x1fe) * -0x200 + uVar28) - 0x20d;
                      plVar23 = (long *)((long)plVar13 + (ulong)uVar4 + 4);
                    }
                    if (0xfe < uVar2) {
                      uVar2 = uVar2 - 0xff;
                      *(char *)plVar23 = -1;
                      plVar23 = (long *)((long)plVar23 + 1);
                    }
                    *(char *)plVar23 = (char)uVar2;
                    plVar23 = (long *)((long)plVar23 + 1);
                  }
                }
                local_b0 = plVar23;
                plVar13 = local_b0;
                if (pcVar22 < pcVar19) goto LAB_001535b2;
                local_a0 = plVar31;
                if (plVar24 < plVar31) {
                  iVar3 = 4;
                  goto LAB_001535b2;
                }
                *(int *)((long)LZ4_stream->table +
                        (ulong)((uint)((ulong)(*(long *)((long)plVar31 + -2) * 0xcf1bbcdcbb) >> 0x1c
                                      ) & 0xfff) * 4) = ((int)plVar31 + -2) - iVar29;
                uVar20 = (ulong)((uint)((ulong)(*plVar31 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
                uVar12 = (ulong)*(uint *)((long)LZ4_stream->table + uVar20 * 4);
                local_70 = (char *)(lVar11 + uVar12);
                pcVar15 = source;
                pcVar21 = (char *)0x0;
                if (local_70 < source) {
                  pcVar15 = pcVar14;
                  pcVar21 = pcVar14 + (uVar16 - (long)source);
                }
                *(int *)((long)LZ4_stream->table + uVar20 * 4) = (int)plVar31 - iVar29;
                if (((long *)(lVar11 + uVar12 + 0xffff) < plVar31) ||
                   (*(int *)(local_70 + (long)pcVar21) != (int)*plVar31)) break;
                plVar13 = (long *)((long)local_b0 + 1);
                *(char *)local_b0 = '\0';
              }
              uVar18 = (ulong)((uint)((ulong)(*(long *)((long)plVar31 + 1) * 0xcf1bbcdcbb) >> 0x1c)
                              & 0xfff);
              iVar3 = 0;
              plVar31 = (long *)((long)plVar31 + 1);
            }
          }
LAB_001535b2:
          local_b0 = plVar13;
        } while (iVar3 == 0);
        if (1 < iVar3 - 3U) goto LAB_00153cd5;
      }
      iVar29 = 0;
      uVar16 = (long)pBVar17 - (long)local_a0;
      pcVar14 = (char *)((long)local_b0 + (uVar16 + 0xf0) / 0xff + (uVar16 - (long)dest) + 1);
      if (pcVar14 <= (char *)(ulong)(uint)maxOutputSize) {
        if (uVar16 < 0xf) {
          *(char *)local_b0 = (char)uVar16 << 4;
        }
        else {
          uVar18 = uVar16 - 0xf;
          *(char *)local_b0 = -0x10;
          plVar24 = (long *)((long)local_b0 + 1);
          if (0xfe < uVar18) {
            uVar18 = (uVar16 - 0x10e) / 0xff;
            memset(plVar24,0xff,uVar18 + 1);
            plVar24 = (long *)((long)local_b0 + uVar18 + 2);
            uVar18 = (uVar16 + uVar18 * -0xff) - 0x10e;
          }
          *(char *)plVar24 = (char)uVar18;
          local_b0 = plVar24;
        }
        memcpy((char *)((long)local_b0 + 1),local_a0,uVar16);
        local_b0 = (long *)((long)local_b0 + uVar16 + 1);
      }
      if (pcVar14 <= (char *)(ulong)(uint)maxOutputSize) {
        iVar29 = (int)local_b0 - iVar26;
      }
    }
  }
LAB_001542e2:
  LZ4_stream->table[0x801] = (longlong)source;
  iVar6 = inputSize;
LAB_001542eb:
  *(int *)(LZ4_stream->table + 0x803) = iVar6;
  *(int *)(LZ4_stream->table + 0x800) = (int)LZ4_stream->table[0x800] + inputSize;
  return iVar29;
}

Assistant:

int LZ4_compress_fast_continue (LZ4_stream_t* LZ4_stream, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* streamPtr = (LZ4_stream_t_internal*)LZ4_stream;
    const BYTE* const dictEnd = streamPtr->dictionary + streamPtr->dictSize;

    const BYTE* smallest = (const BYTE*) source;
    if (streamPtr->initCheck) return 0;   /* Uninitialized structure detected */
    if ((streamPtr->dictSize>0) && (smallest>dictEnd)) smallest = dictEnd;
    LZ4_renormDictT(streamPtr, smallest);
    if (acceleration < 1) acceleration = ACCELERATION_DEFAULT;

    /* Check overlapping input/dictionary space */
    {
        const BYTE* sourceEnd = (const BYTE*) source + inputSize;
        if ((sourceEnd > streamPtr->dictionary) && (sourceEnd < dictEnd))
        {
            streamPtr->dictSize = (U32)(dictEnd - sourceEnd);
            if (streamPtr->dictSize > 64 KB) streamPtr->dictSize = 64 KB;
            if (streamPtr->dictSize < 4) streamPtr->dictSize = 0;
            streamPtr->dictionary = dictEnd - streamPtr->dictSize;
        }
    }

    /* prefix mode : source data follows dictionary */
    if (dictEnd == (const BYTE*)source)
    {
        int result;
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            result = LZ4_compress_generic(LZ4_stream, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, withPrefix64k, dictSmall, acceleration);
        else
            result = LZ4_compress_generic(LZ4_stream, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, withPrefix64k, noDictIssue, acceleration);
        streamPtr->dictSize += (U32)inputSize;
        streamPtr->currentOffset += (U32)inputSize;
        return result;
    }

    /* external dictionary mode */
    {
        int result;
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            result = LZ4_compress_generic(LZ4_stream, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, usingExtDict, dictSmall, acceleration);
        else
            result = LZ4_compress_generic(LZ4_stream, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, usingExtDict, noDictIssue, acceleration);
        streamPtr->dictionary = (const BYTE*)source;
        streamPtr->dictSize = (U32)inputSize;
        streamPtr->currentOffset += (U32)inputSize;
        return result;
    }
}